

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,Cord *value)

{
  bool bVar1;
  bool local_1d;
  int local_1c;
  Cord *pCStack_18;
  int length;
  Cord *value_local;
  CodedInputStream *input_local;
  
  pCStack_18 = value;
  value_local = (Cord *)input;
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&local_1c);
  local_1d = false;
  if (bVar1) {
    local_1d = io::CodedInputStream::ReadCord((CodedInputStream *)value_local,pCStack_18,local_1c);
  }
  return local_1d;
}

Assistant:

inline bool WireFormatLite::ReadBytes(io::CodedInputStream* input,
                                      absl::Cord* value) {
  int length;
  return input->ReadVarintSizeAsInt(&length) && input->ReadCord(value, length);
}